

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.h
# Opt level: O1

void __thiscall jaegertracing::Tracer::Close(Tracer *this)

{
  (*((this->_reporter).
     super___shared_ptr<jaegertracing::reporters::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Reporter[3])();
  (*((this->_sampler).
     super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Sampler[3])();
  (*((this->_restrictionManager)._M_t.
     super___uniq_ptr_impl<jaegertracing::baggage::RestrictionManager,_std::default_delete<jaegertracing::baggage::RestrictionManager>_>
     ._M_t.
     super__Tuple_impl<0UL,_jaegertracing::baggage::RestrictionManager_*,_std::default_delete<jaegertracing::baggage::RestrictionManager>_>
     .super__Head_base<0UL,_jaegertracing::baggage::RestrictionManager_*,_false>._M_head_impl)->
    _vptr_RestrictionManager[3])();
  return;
}

Assistant:

void Close() noexcept override
    {
        try {
            _reporter->close();
            _sampler->close();
            _restrictionManager->close();
        } catch (...) {
            utils::ErrorUtil::logError(*_logger,
                                       "Error occurred in Tracer::Close");
        }
    }